

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O3

void __thiscall common_log::add(common_log *this,ggml_log_level level,char *fmt,__va_list_tag *args)

{
  ggml_log_level *pgVar1;
  size_t sVar2;
  char *pcVar3;
  ggml_log_level gVar4;
  ggml_log_level gVar5;
  int64_t iVar6;
  int iVar7;
  long lVar8;
  pointer pcVar9;
  ulong uVar10;
  pointer pcVar11;
  long lVar12;
  ulong uVar13;
  vector<common_log_entry,_std::allocator<common_log_entry>_> new_entries;
  va_list args_copy;
  vector<common_log_entry,_std::allocator<common_log_entry>_> local_68;
  vector<common_log_entry,_std::allocator<common_log_entry>_> local_48;
  
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar7 == 0) {
    if (this->running == true) {
      pcVar9 = (this->entries).
               super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar2 = this->tail;
      pcVar11 = pcVar9 + sVar2;
      local_48.super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)args->reg_save_area;
      local_48.super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>._M_impl.
      super__Vector_impl_data._M_start = *(pointer *)args;
      local_48.super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)args->overflow_arg_area;
      pcVar3 = pcVar9[sVar2].msg.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar7 = vsnprintf(pcVar3,(long)*(pointer *)
                                      ((long)&pcVar9[sVar2].msg.
                                              super__Vector_base<char,_std::allocator<char>_>.
                                              _M_impl + 8) - (long)pcVar3,fmt,args);
      if ((ulong)((long)*(pointer *)
                         ((long)&pcVar9[sVar2].msg.super__Vector_base<char,_std::allocator<char>_>.
                                 _M_impl + 8) -
                 *(long *)&pcVar9[sVar2].msg.super__Vector_base<char,_std::allocator<char>_>._M_impl
                           .super__Vector_impl_data) <= (ulong)(long)iVar7) {
        std::vector<char,_std::allocator<char>_>::resize(&pcVar9[sVar2].msg,(long)iVar7 + 1);
        pcVar3 = (pcVar11->msg).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        vsnprintf(pcVar3,(long)*(pointer *)
                                ((long)&(pcVar11->msg).
                                        super__Vector_base<char,_std::allocator<char>_>._M_impl + 8)
                         - (long)pcVar3,fmt,&local_48);
      }
      pcVar11->level = level;
      pcVar11->prefix = this->prefix;
      pcVar11->timestamp = 0;
      if (this->timestamps == true) {
        lVar8 = std::chrono::_V2::system_clock::now();
        pcVar11->timestamp = lVar8 / 1000 - this->t_start;
      }
      pcVar11->is_end = false;
      lVar8 = (long)(this->entries).
                    super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->entries).
                    super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>._M_impl.
                    super__Vector_impl_data._M_start >> 4;
      uVar10 = (this->tail + 1) % (ulong)(lVar8 * -0x5555555555555555);
      this->tail = uVar10;
      if (uVar10 == this->head) {
        std::vector<common_log_entry,_std::allocator<common_log_entry>_>::vector
                  (&local_68,lVar8 * 0x5555555555555556,(allocator_type *)&local_48);
        pcVar9 = (this->entries).
                 super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar10 = this->head;
        lVar12 = 0x10;
        lVar8 = 0;
        uVar13 = 0;
        do {
          pcVar11 = local_68.super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pcVar9 = pcVar9 + uVar10;
          gVar4 = *(ggml_log_level *)&pcVar9->prefix;
          iVar6 = pcVar9->timestamp;
          gVar5 = *(ggml_log_level *)((long)&pcVar9->timestamp + 4);
          pgVar1 = (ggml_log_level *)
                   ((long)&(local_68.
                            super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>.
                            _M_impl.super__Vector_impl_data._M_start)->level + lVar8);
          *pgVar1 = pcVar9->level;
          pgVar1[1] = gVar4;
          pgVar1[2] = (ggml_log_level)iVar6;
          pgVar1[3] = gVar5;
          std::vector<char,_std::allocator<char>_>::_M_move_assign
                    ((vector<char,_std::allocator<char>_> *)
                     ((long)&(local_68.
                              super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>
                              ._M_impl.super__Vector_impl_data._M_start)->level + lVar12),
                     &pcVar9->msg);
          (&pcVar11->is_end)[lVar8] = pcVar9->is_end;
          pcVar9 = (this->entries).
                   super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pcVar11 = (this->entries).
                    super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          uVar10 = (this->head + 1) %
                   (ulong)(((long)pcVar11 - (long)pcVar9 >> 4) * -0x5555555555555555);
          this->head = uVar10;
          uVar13 = uVar13 + 1;
          lVar12 = lVar12 + 0x30;
          lVar8 = lVar8 + 0x30;
        } while (uVar10 != this->tail);
        this->head = 0;
        this->tail = uVar13;
        if (uVar13 < (ulong)(((long)local_68.
                                    super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_68.
                                    super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4) *
                            -0x5555555555555555)) {
          do {
            std::vector<char,_std::allocator<char>_>::resize
                      ((vector<char,_std::allocator<char>_> *)
                       ((long)&(local_68.
                                super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>
                                ._M_impl.super__Vector_impl_data._M_start)->level + lVar12),0x100);
            uVar13 = uVar13 + 1;
            lVar12 = lVar12 + 0x30;
          } while (uVar13 < (ulong)(((long)local_68.
                                           super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_68.
                                           super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 4) *
                                   -0x5555555555555555));
          pcVar9 = (this->entries).
                   super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pcVar11 = (this->entries).
                    super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        local_48.super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (this->entries).super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (this->entries).super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_68.super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (this->entries).super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_68.super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        (this->entries).super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_68.super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_68.super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68.super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_48.super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>._M_impl.
        super__Vector_impl_data._M_start = pcVar9;
        local_48.super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>._M_impl.
        super__Vector_impl_data._M_finish = pcVar11;
        std::vector<common_log_entry,_std::allocator<common_log_entry>_>::~vector(&local_48);
        std::vector<common_log_entry,_std::allocator<common_log_entry>_>::~vector(&local_68);
      }
      std::condition_variable::notify_one();
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  std::__throw_system_error(iVar7);
}

Assistant:

void add(enum ggml_log_level level, const char * fmt, va_list args) {
        std::lock_guard<std::mutex> lock(mtx);

        if (!running) {
            // discard messages while the worker thread is paused
            return;
        }

        auto & entry = entries[tail];

        {
            // cannot use args twice, so make a copy in case we need to expand the buffer
            va_list args_copy;
            va_copy(args_copy, args);

#if 1
            const size_t n = vsnprintf(entry.msg.data(), entry.msg.size(), fmt, args);
            if (n >= entry.msg.size()) {
                entry.msg.resize(n + 1);
                vsnprintf(entry.msg.data(), entry.msg.size(), fmt, args_copy);
            }
#else
            // hack for bolding arguments

            std::stringstream ss;
            for (int i = 0; fmt[i] != 0; i++) {
                if (fmt[i] == '%') {
                    ss << LOG_COL_BOLD;
                    while (fmt[i] != ' ' && fmt[i] != ')' && fmt[i] != ']' && fmt[i] != 0) ss << fmt[i++];
                    ss << LOG_COL_DEFAULT;
                    if (fmt[i] == 0) break;
                }
                ss << fmt[i];
            }
            const size_t n = vsnprintf(entry.msg.data(), entry.msg.size(), ss.str().c_str(), args);
            if (n >= entry.msg.size()) {
                entry.msg.resize(n + 1);
                vsnprintf(entry.msg.data(), entry.msg.size(), ss.str().c_str(), args_copy);
            }
#endif
            va_end(args_copy);
        }

        entry.level = level;
        entry.prefix = prefix;
        entry.timestamp = 0;
        if (timestamps) {
            entry.timestamp = t_us() - t_start;
        }
        entry.is_end = false;

        tail = (tail + 1) % entries.size();
        if (tail == head) {
            // expand the buffer
            std::vector<common_log_entry> new_entries(2*entries.size());

            size_t new_tail = 0;

            do {
                new_entries[new_tail] = std::move(entries[head]);

                head     = (head     + 1) % entries.size();
                new_tail = (new_tail + 1);
            } while (head != tail);

            head = 0;
            tail = new_tail;

            for (size_t i = tail; i < new_entries.size(); i++) {
                new_entries[i].msg.resize(256);
            }

            entries = std::move(new_entries);
        }

        cv.notify_one();
    }